

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int side3_7d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar29;
  undefined1 auVar28 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar36;
  double dVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar35;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar68;
  undefined1 auVar67 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dStack_260;
  double dStack_130;
  
  dVar1 = p0[2];
  dVar56 = p1[2] - dVar1;
  dVar54 = p0[3];
  dVar70 = p1[3] - dVar54;
  dVar71 = p0[4];
  dVar30 = p1[4] - dVar71;
  dVar59 = p0[5];
  dVar51 = p1[5] - dVar59;
  dVar2 = p0[6];
  dVar60 = p1[6] - dVar2;
  dVar32 = *p0;
  dVar73 = p0[1];
  dVar18 = p1[1] - dVar73;
  dVar5 = ABS(dVar70);
  if (ABS(dVar70) <= ABS(dVar18)) {
    dVar5 = ABS(dVar18);
  }
  dVar45 = ABS(dVar51);
  if (ABS(dVar51) <= dVar5) {
    dVar45 = dVar5;
  }
  dVar5 = ABS(dVar30);
  if (ABS(dVar30) <= dVar45) {
    dVar5 = dVar45;
  }
  dVar45 = ABS(dVar60);
  if (ABS(dVar60) <= dVar5) {
    dVar45 = dVar5;
  }
  dVar5 = ABS(dVar56);
  if (ABS(dVar56) <= dVar45) {
    dVar5 = dVar45;
  }
  dVar57 = *p1 - dVar32;
  dVar45 = ABS(dVar57);
  if (ABS(dVar57) <= dVar5) {
    dVar45 = dVar5;
  }
  dVar5 = *q0 - dVar32;
  dVar11 = q0[1] - dVar73;
  auVar3._8_4_ = SUB84(dVar11,0);
  auVar3._0_8_ = dVar5;
  auVar3._12_4_ = (int)((ulong)dVar11 >> 0x20);
  dVar20 = ABS(dVar11);
  if (ABS(dVar11) <= ABS(dVar5)) {
    dVar20 = ABS(dVar5);
  }
  dVar11 = q0[2] - dVar1;
  dVar6 = ABS(dVar11);
  if (ABS(dVar11) <= dVar20) {
    dVar6 = dVar20;
  }
  dVar19 = q0[3] - dVar54;
  dVar20 = ABS(dVar19);
  if (ABS(dVar19) <= dVar6) {
    dVar20 = dVar6;
  }
  dVar6 = q0[4] - dVar71;
  dVar7 = ABS(dVar6);
  if (ABS(dVar6) <= dVar20) {
    dVar7 = dVar20;
  }
  dVar31 = q0[5] - dVar59;
  dVar20 = ABS(dVar31);
  if (ABS(dVar31) <= dVar7) {
    dVar20 = dVar7;
  }
  dVar63 = q0[6] - dVar2;
  dVar7 = ABS(dVar63);
  if (ABS(dVar63) <= dVar20) {
    dVar7 = dVar20;
  }
  dVar21 = *q1 - dVar32;
  dVar20 = ABS(dVar21);
  if (ABS(dVar21) <= dVar7) {
    dVar20 = dVar7;
  }
  dVar7 = q1[1] - dVar73;
  dVar8 = ABS(dVar7);
  if (ABS(dVar7) <= dVar20) {
    dVar8 = dVar20;
  }
  dVar22 = q1[2] - dVar1;
  dVar20 = ABS(dVar22);
  if (ABS(dVar22) <= dVar8) {
    dVar20 = dVar8;
  }
  dVar8 = q1[3] - dVar54;
  dVar9 = ABS(dVar8);
  if (ABS(dVar8) <= dVar20) {
    dVar9 = dVar20;
  }
  dVar23 = q1[4] - dVar71;
  dVar20 = ABS(dVar23);
  if (ABS(dVar23) <= dVar9) {
    dVar20 = dVar9;
  }
  dVar9 = q1[5] - dVar59;
  dVar10 = ABS(dVar9);
  if (ABS(dVar9) <= dVar20) {
    dVar10 = dVar20;
  }
  dVar61 = q1[6] - dVar2;
  dVar20 = ABS(dVar61);
  if (ABS(dVar61) <= dVar10) {
    dVar20 = dVar10;
  }
  dVar10 = *q2 - dVar32;
  dVar12 = ABS(dVar10);
  if (ABS(dVar10) <= dVar20) {
    dVar12 = dVar20;
  }
  dVar24 = *p2 - dVar32;
  auVar41._0_8_ = ABS(dVar24);
  auVar41._8_8_ = dVar12;
  dVar34 = p2[1] - dVar73;
  dVar42 = q2[1] - dVar73;
  auVar37._0_8_ = ABS(dVar34);
  auVar37._8_8_ = ABS(dVar42);
  auVar38 = maxpd(auVar37,auVar41);
  dVar66 = p2[2] - dVar1;
  dVar68 = q2[2] - dVar1;
  auVar67._0_8_ = ABS(dVar66);
  auVar67._8_8_ = ABS(dVar68);
  auVar38 = maxpd(auVar67,auVar38);
  dVar25 = p2[4] - dVar71;
  dVar29 = q2[4] - dVar71;
  dVar20 = p2[5] - dVar59;
  dVar12 = q2[5] - dVar59;
  dVar46 = p2[6] - dVar2;
  dVar48 = q2[6] - dVar2;
  dVar35 = p2[3] - dVar54;
  dVar72 = q2[3] - dVar54;
  auVar39._0_8_ = ABS(dVar35);
  auVar39._8_8_ = ABS(dVar72);
  auVar38 = maxpd(auVar39,auVar38);
  auVar28._0_8_ = ABS(dVar25);
  auVar28._8_8_ = ABS(dVar29);
  auVar38 = maxpd(auVar28,auVar38);
  auVar40._0_8_ = ABS(dVar20);
  auVar40._8_8_ = ABS(dVar12);
  auVar41 = maxpd(auVar40,auVar38);
  auVar38._0_8_ = ABS(dVar46);
  auVar38._8_8_ = ABS(dVar48);
  auVar38 = maxpd(auVar38,auVar41);
  dVar16 = auVar38._0_8_;
  dVar17 = auVar38._8_8_;
  dVar26 = dVar45;
  if ((dVar45 < dVar16) || (dVar26 = dVar16, dVar36 = dVar45, dVar45 <= dVar16)) {
    dVar36 = dVar16;
  }
  dVar43 = dVar17;
  if ((dVar26 <= dVar17) && (dVar43 = dVar26, dVar36 < dVar17)) {
    dVar36 = dVar17;
  }
  iVar13 = 0;
  iVar14 = 0;
  if ((1.369188811838835e-74 <= dVar43) && (iVar14 = iVar13, dVar36 <= 1.2980742146337065e+33)) {
    dStack_130 = auVar3._8_8_;
    auVar4._8_4_ = SUB84(dVar12,0);
    auVar4._0_8_ = dVar20;
    auVar4._12_4_ = (int)((ulong)dVar12 >> 0x20);
    dStack_260 = auVar4._8_8_;
    dVar47 = dVar60 * dVar63 +
             dVar51 * dVar31 +
             dVar30 * dVar6 +
             dVar70 * dVar19 + dVar56 * dVar11 + dVar57 * dVar5 + dVar18 * dStack_130;
    dVar58 = dVar60 * dVar61 +
             dVar51 * dVar9 +
             dVar30 * dVar23 + dVar70 * dVar8 + dVar56 * dVar22 + dVar57 * dVar21 + dVar18 * dVar7;
    dVar12 = dVar60 * dVar48 +
             dVar51 * dStack_260 +
             dVar30 * dVar29 + dVar70 * dVar72 + dVar56 * dVar68 + dVar57 * dVar10 + dVar18 * dVar42
    ;
    dVar52 = dVar46 * dVar63 +
             dVar20 * dVar31 +
             dVar25 * dVar6 +
             dVar35 * dVar19 + dVar66 * dVar11 + dVar24 * dVar5 + dVar34 * dStack_130;
    dVar36 = dVar46 * dVar61 +
             dVar20 * dVar9 +
             dVar25 * dVar23 + dVar35 * dVar8 + dVar66 * dVar22 + dVar24 * dVar21 + dVar34 * dVar7;
    dVar69 = dVar46 * dVar48 +
             dVar20 * dStack_260 +
             dVar25 * dVar29 + dVar35 * dVar72 + dVar66 * dVar68 + dVar24 * dVar10 + dVar34 * dVar42
    ;
    dVar47 = dVar47 + dVar47;
    dVar58 = dVar58 + dVar58;
    dVar12 = dVar12 + dVar12;
    dVar52 = dVar52 + dVar52;
    dVar36 = dVar36 + dVar36;
    dVar69 = dVar69 + dVar69;
    dVar62 = dVar58 * dVar69 - dVar36 * dVar12;
    dVar43 = dVar12 * dVar52 - dVar69 * dVar47;
    dVar53 = dVar47 * dVar36 - dVar52 * dVar58;
    dVar26 = dVar62 + dVar43 + dVar53;
    dVar64 = dVar45 * dVar17 * dVar16 * dVar17 * 6.33127335329799e-13;
    if (dVar26 <= dVar64) {
      if (-dVar64 <= dVar26) {
        return 0;
      }
      iVar13 = -1;
    }
    else {
      iVar13 = 1;
    }
    dVar32 = *p3 - dVar32;
    dVar73 = p3[1] - dVar73;
    dVar1 = p3[2] - dVar1;
    dVar54 = p3[3] - dVar54;
    dVar71 = p3[4] - dVar71;
    dVar59 = p3[5] - dVar59;
    dVar2 = p3[6] - dVar2;
    uVar49 = SUB84(dVar45,0);
    uVar50 = (undefined4)((ulong)dVar45 >> 0x20);
    dVar64 = ABS(dVar32);
    if (ABS(dVar32) <= dVar45) {
      dVar64 = dVar45;
    }
    dVar44 = ABS(dVar73);
    if (ABS(dVar73) <= dVar64) {
      dVar44 = dVar64;
    }
    dVar64 = ABS(dVar1);
    if (ABS(dVar1) <= dVar44) {
      dVar64 = dVar44;
    }
    dVar44 = ABS(dVar54);
    if (ABS(dVar54) <= dVar64) {
      dVar44 = dVar64;
    }
    dVar64 = ABS(dVar71);
    if (ABS(dVar71) <= dVar44) {
      dVar64 = dVar44;
    }
    dVar44 = ABS(dVar59);
    if (ABS(dVar59) <= dVar64) {
      dVar44 = dVar64;
    }
    dVar64 = dVar17;
    if (dVar17 <= dVar45) {
      dVar64 = dVar45;
    }
    dVar27 = dVar16;
    if (dVar16 <= dVar64) {
      dVar27 = dVar64;
    }
    dVar65 = ABS(dVar2);
    if (ABS(dVar2) <= dVar44) {
      dVar65 = dVar44;
    }
    dVar44 = dVar65;
    if (dVar65 <= dVar27) {
      dVar44 = dVar27;
    }
    dVar27 = dVar45;
    if (dVar45 <= dVar44) {
      dVar27 = dVar44;
    }
    dVar44 = dVar17;
    if (dVar17 <= dVar27) {
      dVar44 = dVar27;
    }
    dVar27 = dVar65;
    if (dVar65 <= dVar64) {
      dVar27 = dVar64;
    }
    if (dVar45 <= dVar27) {
      uVar49 = SUB84(dVar27,0);
      uVar50 = (undefined4)((ulong)dVar27 >> 0x20);
    }
    uVar15 = -(ulong)((double)CONCAT44(uVar50,uVar49) < dVar17);
    dVar45 = (double)(~-(ulong)(dVar16 < dVar64) & (ulong)dVar64 |
                     (ulong)dVar16 & -(ulong)(dVar16 < dVar64));
    dVar55 = (double)(~uVar15 & CONCAT44(uVar50,uVar49) | (ulong)dVar17 & uVar15);
    uVar15 = -(ulong)(dVar65 < dVar45);
    dVar27 = (double)(~uVar15 & (ulong)dVar45 | (ulong)dVar65 & uVar15);
    dVar33 = (double)(~-(ulong)(dVar44 < dVar55) & (ulong)dVar44 |
                     (ulong)dVar55 & -(ulong)(dVar44 < dVar55));
    dVar45 = dVar33;
    dVar44 = dVar64;
    if ((dVar27 <= dVar33) && (dVar45 = dVar27, dVar44 = dVar33, dVar33 <= dVar64)) {
      dVar44 = dVar64;
    }
    dVar27 = dVar17;
    if (dVar45 <= dVar17) {
      dVar27 = dVar45;
    }
    dVar45 = dVar55;
    if (dVar27 <= dVar55) {
      dVar45 = dVar27;
    }
    if ((3.045483035656025e-50 <= dVar45) && (dVar44 <= 1.2980742146337065e+33)) {
      dVar18 = dVar60 * dVar60 +
               dVar51 * dVar51 +
               dVar30 * dVar30 +
               dVar70 * dVar70 + dVar56 * dVar56 + dVar57 * dVar57 + dVar18 * dVar18;
      dVar51 = dVar46 * dVar46 +
               dVar20 * dVar20 +
               dVar25 * dVar25 +
               dVar35 * dVar35 + dVar66 * dVar66 + dVar24 * dVar24 + dVar34 * dVar34;
      dVar30 = dVar63 * dVar2 +
               dVar31 * dVar59 +
               dVar6 * dVar71 +
               dVar19 * dVar54 + dVar11 * dVar1 + dVar5 * dVar32 + dStack_130 * dVar73;
      dVar56 = dVar61 * dVar2 +
               dVar9 * dVar59 +
               dVar23 * dVar71 + dVar8 * dVar54 + dVar22 * dVar1 + dVar21 * dVar32 + dVar7 * dVar73;
      dVar5 = dVar48 * dVar2 +
              dStack_260 * dVar59 +
              dVar29 * dVar71 + dVar72 * dVar54 + dVar68 * dVar1 + dVar10 * dVar32 + dVar42 * dVar73
      ;
      dVar1 = dVar26 * (dVar2 * dVar2 +
                       dVar59 * dVar59 +
                       dVar71 * dVar71 +
                       dVar54 * dVar54 + dVar1 * dVar1 + dVar32 * dVar32 + dVar73 * dVar73) -
              ((dVar53 + (dVar52 - dVar36) * dVar18 + (dVar58 - dVar47) * dVar51) * (dVar5 + dVar5)
              + (dVar43 + (dVar69 - dVar52) * dVar18 + (dVar47 - dVar12) * dVar51) *
                (dVar56 + dVar56) +
                (dVar62 + (dVar36 - dVar69) * dVar18 + (dVar12 - dVar58) * dVar51) *
                (dVar30 + dVar30));
      dVar54 = dVar65 * dVar17 * dVar16 * dVar64 * dVar55 * dVar33 * 2.7887354880433616e-11;
      if (dVar1 <= dVar54) {
        if (-dVar54 <= dVar1) {
          return 0;
        }
        iVar14 = -1;
      }
      else {
        iVar14 = 1;
      }
      iVar14 = iVar14 * iVar13;
    }
  }
  return iVar14;
}

Assistant:

inline int side3_7d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double l1;
    l1 = (1 * (((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double l2;
    l2 = (1 * (((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double p3_6_p0_6 = (p3[6] - p0[6]);
    double l3;
    l3 = (1 * (((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)) + (p3_6_p0_6 * p3_6_p0_6)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double a10;
    a10 = (2 * (((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double a11;
    a11 = (2 * (((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double q2_6_p0_6 = (q2[6] - p0[6]);
    double a12;
    a12 = (2 * (((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)) + (p1_6_p0_6 * q2_6_p0_6)));
    double a20;
    a20 = (2 * (((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)));
    double a21;
    a21 = (2 * (((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)));
    double a22;
    a22 = (2 * (((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)) + (p2_6_p0_6 * q2_6_p0_6)));
    double a30;
    a30 = (2 * (((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)) + (p3_6_p0_6 * q0_6_p0_6)));
    double a31;
    a31 = (2 * (((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)) + (p3_6_p0_6 * q1_6_p0_6)));
    double a32;
    a32 = (2 * (((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)) + (p3_6_p0_6 * q2_6_p0_6)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_1_p0_1);
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    double max2 = fabs(p2_0_p0_0);
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_3_p0_3)) )
    {
        max2 = fabs(p2_3_p0_3);
    } 
    if( (max2 < fabs(p2_4_p0_4)) )
    {
        max2 = fabs(p2_4_p0_4);
    } 
    if( (max2 < fabs(p2_5_p0_5)) )
    {
        max2 = fabs(p2_5_p0_5);
    } 
    if( (max2 < fabs(p2_6_p0_6)) )
    {
        max2 = fabs(p2_6_p0_6);
    } 
    double max3 = fabs(q0_0_p0_0);
    if( (max3 < fabs(q0_1_p0_1)) )
    {
        max3 = fabs(q0_1_p0_1);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q0_4_p0_4)) )
    {
        max3 = fabs(q0_4_p0_4);
    } 
    if( (max3 < fabs(q0_5_p0_5)) )
    {
        max3 = fabs(q0_5_p0_5);
    } 
    if( (max3 < fabs(q0_6_p0_6)) )
    {
        max3 = fabs(q0_6_p0_6);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q1_4_p0_4)) )
    {
        max3 = fabs(q1_4_p0_4);
    } 
    if( (max3 < fabs(q1_5_p0_5)) )
    {
        max3 = fabs(q1_5_p0_5);
    } 
    if( (max3 < fabs(q1_6_p0_6)) )
    {
        max3 = fabs(q1_6_p0_6);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    if( (max3 < fabs(q2_4_p0_4)) )
    {
        max3 = fabs(q2_4_p0_4);
    } 
    if( (max3 < fabs(q2_5_p0_5)) )
    {
        max3 = fabs(q2_5_p0_5);
    } 
    if( (max3 < fabs(q2_6_p0_6)) )
    {
        max3 = fabs(q2_6_p0_6);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.36918881183883509035e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (6.33127335329798996022e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4;
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    max4 = max7;
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    double max5 = max1;
    if( (max5 < fabs(p3_0_p0_0)) )
    {
        max5 = fabs(p3_0_p0_0);
    } 
    if( (max5 < fabs(p3_1_p0_1)) )
    {
        max5 = fabs(p3_1_p0_1);
    } 
    if( (max5 < fabs(p3_2_p0_2)) )
    {
        max5 = fabs(p3_2_p0_2);
    } 
    if( (max5 < fabs(p3_3_p0_3)) )
    {
        max5 = fabs(p3_3_p0_3);
    } 
    if( (max5 < fabs(p3_4_p0_4)) )
    {
        max5 = fabs(p3_4_p0_4);
    } 
    if( (max5 < fabs(p3_5_p0_5)) )
    {
        max5 = fabs(p3_5_p0_5);
    } 
    if( (max5 < fabs(p3_6_p0_6)) )
    {
        max5 = fabs(p3_6_p0_6);
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max1) )
    {
        max4 = max1;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max6 = max7;
    if( (max6 < max5) )
    {
        max6 = max5;
    } 
    if( (max6 < max1) )
    {
        max6 = max1;
    } 
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max7;
    upper_bound_1 = max7;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (lower_bound_1 < 3.04548303565602498901e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.78873548804336160566e-11 * (((((max5 * max3) * max2) * max7) * max6) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}